

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::TiledOutputFile::writeTiles
          (TiledOutputFile *this,int dx1,int dx2,int dy1,int dy2,int lx,int ly)

{
  value_type pTVar1;
  bool bVar2;
  size_type sVar3;
  ArgExc *pAVar4;
  ostream *poVar5;
  int *piVar6;
  TileBuffer *this_00;
  Data *ofd;
  size_type sVar7;
  reference ppTVar8;
  IoExc *this_01;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  void *__stat_loc;
  TiledOutputFile *in_RDI;
  int in_R8D;
  int in_R9D;
  int unaff_retaddr;
  int unaff_retaddr_00;
  int in_stack_00000008;
  undefined4 in_stack_0000000c;
  OutputStreamMutex *in_stack_00000010;
  char *in_stack_00000020;
  int in_stack_00000028;
  stringstream _iex_replace_s;
  BaseExc *e;
  TileBuffer *tileBuffer;
  size_t i;
  string *exception;
  TileBuffer *writeBuffer;
  int dyWrite;
  int dxWrite;
  int nextWriteBuffer;
  int dyComp;
  int dxComp;
  int nextCompBuffer;
  TaskGroup taskGroup;
  int numTasks;
  int numTiles;
  int dY;
  int dyStart;
  stringstream _iex_throw_s;
  Lock lock;
  int in_stack_fffffffffffffba0;
  int in_stack_fffffffffffffba4;
  undefined4 in_stack_fffffffffffffba8;
  int in_stack_fffffffffffffbac;
  Data *in_stack_fffffffffffffbb0;
  undefined8 in_stack_fffffffffffffbd0;
  undefined8 in_stack_fffffffffffffbd8;
  Data *in_stack_fffffffffffffbe0;
  TaskGroup *in_stack_fffffffffffffbe8;
  TileBuffer *group;
  TileBufferTask *in_stack_fffffffffffffbf0;
  undefined8 in_stack_fffffffffffffc00;
  undefined8 in_stack_fffffffffffffc08;
  size_type local_218;
  string *local_210;
  int local_1fc;
  uint local_1f8;
  int local_1f0;
  int local_1ec;
  TaskGroup local_1e8 [12];
  int local_1dc;
  int local_1d8;
  int local_1d4 [3];
  stringstream local_1c8 [16];
  ostream local_1b8 [412];
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  TiledOutputFile *pTVar9;
  
  local_1c = in_R9D;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  pTVar9 = in_RDI;
  IlmThread_2_5::Lock::Lock
            ((Lock *)in_stack_fffffffffffffbb0,
             (Mutex *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
             SUB41((uint)in_stack_fffffffffffffba4 >> 0x18,0));
  sVar3 = std::
          vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
          ::size(&in_RDI->_data->slices);
  if (sVar3 == 0) {
    pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar4,"No frame buffer specified as pixel data source.");
    __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  bVar2 = isValidTile(in_RDI,local_c,local_14,local_1c,in_stack_00000008);
  if ((!bVar2) || (bVar2 = isValidTile(in_RDI,local_10,local_18,local_1c,in_stack_00000008), !bVar2)
     ) {
    pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar4,"Tile coordinates are invalid.");
    __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  bVar2 = isValidLevel((TiledOutputFile *)
                       CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                       in_stack_fffffffffffffba4,in_stack_fffffffffffffba0);
  if (!bVar2) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1c8);
    poVar5 = std::operator<<(local_1b8,"Level coordinate (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1c);
    poVar5 = std::operator<<(poVar5,", ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,in_stack_00000008);
    std::operator<<(poVar5,") is invalid.");
    pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar4,local_1c8);
    __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  if (local_10 < local_c) {
    std::swap<int>(&local_c,&local_10);
  }
  if (local_18 < local_14) {
    std::swap<int>(&local_14,&local_18);
  }
  local_1d4[2] = local_14;
  local_1d4[1] = 1;
  if (in_RDI->_data->lineOrder == DECREASING_Y) {
    local_1d4[2] = local_18;
    local_1d4[1] = 0xffffffff;
  }
  local_1d4[0] = ((local_10 - local_c) + 1) * ((local_18 - local_14) + 1);
  sVar3 = std::
          vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
          ::size(&in_RDI->_data->tileBuffers);
  local_1dc = (int)sVar3;
  piVar6 = std::min<int>(&local_1dc,local_1d4);
  local_1d8 = *piVar6;
  IlmThread_2_5::TaskGroup::TaskGroup(local_1e8);
  local_1ec = 0;
  local_1f0 = local_c;
  while (local_1ec < local_1d8) {
    in_stack_fffffffffffffbf0 = (TileBufferTask *)operator_new(0x20);
    local_1ec = local_1ec + 1;
    in_stack_fffffffffffffba0 = in_stack_00000008;
    anon_unknown_5::TileBufferTask::TileBufferTask
              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
               (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20),(int)in_stack_fffffffffffffbd8,
               (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20),(int)in_stack_fffffffffffffc00,
               (int)in_stack_fffffffffffffc08);
    IlmThread_2_5::ThreadPool::addGlobalTask(&in_stack_fffffffffffffbf0->super_Task);
    local_1f0 = local_1f0 + 1;
    if (local_10 < local_1f0) {
      local_1f0 = local_c;
    }
  }
  local_1f8 = 0;
  local_1fc = local_c;
  while ((int)local_1f8 < local_1d4[0]) {
    __stat_loc = (void *)(ulong)local_1f8;
    this_00 = Data::getTileBuffer(in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac);
    group = this_00;
    anon_unknown_5::TileBuffer::wait((TileBuffer *)this_00,__stat_loc);
    in_stack_fffffffffffffba0 = *(int *)&this_00->compressor;
    anon_unknown_5::bufferedTileWrite
              (in_stack_00000010,(Data *)CONCAT44(in_stack_0000000c,in_stack_00000008),
               unaff_retaddr_00,unaff_retaddr,(int)((ulong)pTVar9 >> 0x20),(int)pTVar9,
               in_stack_00000020,in_stack_00000028);
    anon_unknown_5::TileBuffer::post((TileBuffer *)0x1be49d);
    if (local_1ec < local_1d4[0]) {
      ofd = (Data *)operator_new(0x20);
      in_stack_fffffffffffffba0 = in_stack_00000008;
      anon_unknown_5::TileBufferTask::TileBufferTask
                (in_stack_fffffffffffffbf0,(TaskGroup *)group,ofd,
                 (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20),(int)in_stack_fffffffffffffbd8,
                 (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20),(int)in_stack_fffffffffffffc00,
                 (int)in_stack_fffffffffffffc08);
      IlmThread_2_5::ThreadPool::addGlobalTask((Task *)ofd);
    }
    local_1f8 = local_1f8 + 1;
    local_1fc = local_1fc + 1;
    if (local_10 < local_1fc) {
      local_1fc = local_c;
    }
    local_1ec = local_1ec + 1;
    local_1f0 = local_1f0 + 1;
    if (local_10 < local_1f0) {
      local_1f0 = local_c;
    }
  }
  IlmThread_2_5::TaskGroup::~TaskGroup(local_1e8);
  local_210 = (string *)0x0;
  local_218 = 0;
  while (sVar3 = local_218,
        sVar7 = std::
                vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                ::size(&in_RDI->_data->tileBuffers), sVar3 < sVar7) {
    ppTVar8 = std::
              vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
              ::operator[](&in_RDI->_data->tileBuffers,local_218);
    pTVar1 = *ppTVar8;
    if ((((byte)(pTVar1->exception)._M_dataplus & 1) != 0) && (local_210 == (string *)0x0)) {
      local_210 = (string *)&(pTVar1->exception)._M_string_length;
    }
    (pTVar1->exception)._M_dataplus = (_Alloc_hider)0x0;
    local_218 = local_218 + 1;
  }
  if (local_210 == (string *)0x0) {
    IlmThread_2_5::Lock::~Lock
              ((Lock *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
    return;
  }
  this_01 = (IoExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::IoExc::IoExc(this_01,local_210);
  __cxa_throw(this_01,&Iex_2_5::IoExc::typeinfo,Iex_2_5::IoExc::~IoExc);
}

Assistant:

void	
TiledOutputFile::writeTiles (int dx1, int dx2, int dy1, int dy2,
                             int lx, int ly)
{
    try
    {
        Lock lock (*_streamData);

        if (_data->slices.size() == 0)
	    throw IEX_NAMESPACE::ArgExc ("No frame buffer specified "
			       "as pixel data source.");

	if (!isValidTile (dx1, dy1, lx, ly) || !isValidTile (dx2, dy2, lx, ly))
	    throw IEX_NAMESPACE::ArgExc ("Tile coordinates are invalid.");

	if (!isValidLevel (lx, ly))
	    THROW (IEX_NAMESPACE::ArgExc,
                   "Level coordinate "
                   "(" << lx << ", " << ly << ") "
                   "is invalid.");
        //
        // Determine the first and last tile coordinates in both dimensions
        // based on the file's lineOrder
        //
                               
        if (dx1 > dx2)
            swap (dx1, dx2);
        
        if (dy1 > dy2)
            swap (dy1, dy2);
        
        int dyStart = dy1;
	int dY      = 1;
    
        if (_data->lineOrder == DECREASING_Y)
        {
            dyStart = dy2;
            dY      = -1;
        }
        
        int numTiles = (dx2 - dx1 + 1) * (dy2 - dy1 + 1);
        int numTasks = min ((int)_data->tileBuffers.size(), numTiles);

        //
        // Create a task group for all tile buffer tasks.  When the
	// task group goes out of scope, the destructor waits until
	// all tasks are complete.
        //

        {
            TaskGroup taskGroup;
    
            //
            // Add in the initial compression tasks to the thread pool
            //
    
            int nextCompBuffer = 0;
	    int dxComp         = dx1;
	    int dyComp         = dyStart;

            while (nextCompBuffer < numTasks)
            {
                ThreadPool::addGlobalTask (new TileBufferTask (&taskGroup,
                                                               _data,
                                                               nextCompBuffer++,
                                                               dxComp, dyComp,
                                                               lx, ly));
                dxComp++;

                if (dxComp > dx2)
                {
                    dxComp = dx1;
                    dyComp += dY;
                }
            }
            
            //
            // Write the compressed buffers and add in more compression
	    // tasks until done
            //
    
            int nextWriteBuffer = 0;
	    int dxWrite         = dx1;
	    int dyWrite         = dyStart;

            while (nextWriteBuffer < numTiles)
            {
		//
                // Wait until the nextWriteBuffer is ready to be written
		//

                TileBuffer* writeBuffer =
                                    _data->getTileBuffer (nextWriteBuffer);

                writeBuffer->wait();
    
		//
                // Write the tilebuffer
		//

                bufferedTileWrite (_streamData, _data, dxWrite, dyWrite, lx, ly,
                                   writeBuffer->dataPtr,
                                   writeBuffer->dataSize);
                
		//
                // Release the lock on nextWriteBuffer
		//

                writeBuffer->post();
                
		//
                // If there are no more tileBuffers to compress, then
		// only continue to write out remaining tileBuffers,
		// otherwise keep adding compression tasks.
		//

                if (nextCompBuffer < numTiles)
                {
		    //
                    // add nextCompBuffer as a compression Task
		    //

                    ThreadPool::addGlobalTask
			(new TileBufferTask (&taskGroup,
					     _data,
					     nextCompBuffer,
                                             dxComp, dyComp,
					     lx, ly));
                }
    
                nextWriteBuffer++;
                dxWrite++;

                if (dxWrite > dx2)
                {
                    dxWrite = dx1;
                    dyWrite += dY;
                }
                    
                nextCompBuffer++;
                dxComp++;

                if (dxComp > dx2)
                {
                    dxComp = dx1;
                    dyComp += dY;
                }
            }

	    //
            // finish all tasks
	    //
        }

	//
	// Exeption handling:
	//
	// TileBufferTask::execute() may have encountered exceptions, but
	// those exceptions occurred in another thread, not in the thread
	// that is executing this call to TiledOutputFile::writeTiles().
	// TileBufferTask::execute() has caught all exceptions and stored
	// the exceptions' what() strings in the tile buffers.
	// Now we check if any tile buffer contains a stored exception; if
	// this is the case then we re-throw the exception in this thread.
	// (It is possible that multiple tile buffers contain stored
	// exceptions.  We re-throw the first exception we find and
	// ignore all others.)
	//

	const string *exception = 0;

        for (size_t i = 0; i < _data->tileBuffers.size(); ++i)
	{
            TileBuffer *tileBuffer = _data->tileBuffers[i];

	    if (tileBuffer->hasException && !exception)
		exception = &tileBuffer->exception;

	    tileBuffer->hasException = false;
	}

	if (exception)
	    throw IEX_NAMESPACE::IoExc (*exception);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        REPLACE_EXC (e, "Failed to write pixel data to image "
                     "file \"" << fileName() << "\". " << e.what());
        throw;
    }
}